

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O3

void __thiscall TCPSocket::ConnectionClosed::ConnectionClosed(ConnectionClosed *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Connection closed","");
  TCPSocketError::TCPSocketError(&this->super_TCPSocketError,&local_38,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_TCPSocketError = &PTR__TCPSocketError_001219d0;
  return;
}

Assistant:

ConnectionClosed() : TCPSocketError("Connection closed"){}